

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void RegisterNodeRPCCommands(CRPCTable *t)

{
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffed8;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterNodeRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterNodeRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_40,"control",(allocator<char> *)&stack0xfffffffffffffedf);
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands,in_stack_fffffffffffffed8,
                 (RpcMethodFnType)local_40);
      std::__cxx11::string::string<std::allocator<char>>
                (local_60,"control",(allocator<char> *)&stack0xfffffffffffffede);
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands + 1,in_stack_fffffffffffffed8,
                 (RpcMethodFnType)local_60);
      std::__cxx11::string::string<std::allocator<char>>
                (local_80,"util",(allocator<char> *)&stack0xfffffffffffffedd);
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands + 2,in_stack_fffffffffffffed8,
                 (RpcMethodFnType)local_80);
      std::__cxx11::string::string<std::allocator<char>>
                (local_a0,"hidden",(allocator<char> *)&stack0xfffffffffffffedc);
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands + 3,in_stack_fffffffffffffed8,
                 (RpcMethodFnType)local_a0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_c0,"hidden",(allocator<char> *)&stack0xfffffffffffffedb);
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands + 4,in_stack_fffffffffffffed8,
                 (RpcMethodFnType)local_c0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_e0,"hidden",(allocator<char> *)&stack0xfffffffffffffeda);
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands + 5,in_stack_fffffffffffffed8,
                 (RpcMethodFnType)local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_100,"hidden",(allocator<char> *)&stack0xfffffffffffffed9);
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands + 6,in_stack_fffffffffffffed8,
                 (RpcMethodFnType)local_100);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffee0,"hidden",
                 (allocator<char> *)&stack0xfffffffffffffed8);
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands + 7,in_stack_fffffffffffffed8,
                 (RpcMethodFnType)&stack0xfffffffffffffee0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_40);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterNodeRPCCommands(CRPCTable&)::commands);
    }
  }
  pcmd = RegisterNodeRPCCommands::commands;
  for (lVar2 = 0x400; lVar2 != 0; lVar2 = lVar2 + -0x80) {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterNodeRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"control", &getmemoryinfo},
        {"control", &logging},
        {"util", &getindexinfo},
        {"hidden", &setmocktime},
        {"hidden", &mockscheduler},
        {"hidden", &echo},
        {"hidden", &echojson},
        {"hidden", &echoipc},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}